

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

StatsPublisher *
anon_unknown.dwarf_17339::createStatsPublisher(StatsPublisher *__return_storage_ptr__,Value *v)

{
  return_type rVar1;
  Value *pVVar2;
  return_type __x;
  invalid_argument *this;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"bind",&local_39);
  pVVar2 = toml::Value::find(v,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (pVVar2 != (Value *)0x0) {
    (__return_storage_ptr__->bind).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->sendBuffer = 0;
    (__return_storage_ptr__->bind).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->bind).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __x = toml::Value::as<std::__cxx11::string>(pVVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->bind,__x);
    std::__cxx11::string::string((string *)&local_38,"send_buffer",&local_39);
    pVVar2 = toml::Value::find(v,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pVVar2 != (Value *)0x0) {
      rVar1 = toml::Value::as<int>(pVVar2);
      __return_storage_ptr__->sendBuffer = (long)rVar1;
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected publisher section to have \"bind\" key");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Config::StatsPublisher createStatsPublisher(const toml::Value& v) {
  auto bind = v.find("bind");
  if (!bind) {
    throw std::invalid_argument("Expected publisher section to have \"bind\" key");
  }

  Config::StatsPublisher out;
  out.bind.push_back(bind->as<std::string>());

  // Optional send buffer size
  auto sendBuffer = v.find("send_buffer");
  if (sendBuffer) {
    out.sendBuffer = sendBuffer->as<int>();
  }

  return out;
}